

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet,Expr *p)

{
  ExprList *pEVar1;
  Bitmask BVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ExprList_item *pEVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar5 = 0;
  do {
    if ((p->op == 0x9e) && ((p->flags & 8) == 0)) {
      if ((long)pMaskSet->n < 1) {
LAB_00180741:
        uVar7 = 0;
        goto LAB_00180777;
      }
      uVar7 = 0;
      lVar4 = 0;
      goto LAB_00180730;
    }
    if ((p->flags & 0x804000) != 0) goto LAB_00180741;
    if ((p->op == 0xa7) && (0 < (long)pMaskSet->n)) {
      lVar4 = 0;
      do {
        if (pMaskSet->ix[lVar4] == p->iTable) {
          uVar7 = 1L << ((byte)lVar4 & 0x3f);
          goto LAB_00180691;
        }
        lVar4 = lVar4 + 1;
      } while (pMaskSet->n != lVar4);
    }
    uVar7 = 0;
LAB_00180691:
    if (p->pLeft != (Expr *)0x0) {
      BVar2 = sqlite3WhereExprUsageNN(pMaskSet,p->pLeft);
      uVar7 = uVar7 | BVar2;
    }
    if (p->pRight == (Expr *)0x0) break;
    uVar5 = uVar5 | uVar7;
    p = p->pRight;
  } while( true );
  if ((p->flags >> 0xb & 1) == 0) {
    pEVar1 = (p->x).pList;
    if (pEVar1 != (ExprList *)0x0) {
      if (pEVar1->nExpr < 1) {
        uVar8 = 0;
      }
      else {
        pEVar6 = pEVar1->a;
        lVar4 = 0;
        uVar8 = 0;
        do {
          if (pEVar6->pExpr == (Expr *)0x0) {
            uVar3 = 0;
          }
          else {
            uVar3 = sqlite3WhereExprUsageNN(pMaskSet,pEVar6->pExpr);
          }
          uVar8 = uVar8 | uVar3;
          lVar4 = lVar4 + 1;
          pEVar6 = pEVar6 + 1;
        } while (lVar4 < pEVar1->nExpr);
      }
      uVar7 = uVar7 | uVar8;
    }
  }
  else {
    if ((p->flags & 0x20) != 0) {
      pMaskSet->bVarSelect = 1;
    }
    BVar2 = exprSelectUsage(pMaskSet,(p->x).pSelect);
    uVar7 = uVar7 | BVar2;
  }
  goto LAB_00180777;
  while (lVar4 = lVar4 + 1, pMaskSet->n != lVar4) {
LAB_00180730:
    if (pMaskSet->ix[lVar4] == p->iTable) {
      uVar7 = 1L << ((byte)lVar4 & 0x3f);
      break;
    }
  }
LAB_00180777:
  return uVar5 | uVar7;
}

Assistant:

SQLITE_PRIVATE Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet, Expr *p){
  Bitmask mask;
  if( p->op==TK_COLUMN && !ExprHasProperty(p, EP_FixedCol) ){
    return sqlite3WhereGetMask(pMaskSet, p->iTable);
  }else if( ExprHasProperty(p, EP_TokenOnly|EP_Leaf) ){
    assert( p->op!=TK_IF_NULL_ROW );
    return 0;
  }
  mask = (p->op==TK_IF_NULL_ROW) ? sqlite3WhereGetMask(pMaskSet, p->iTable) : 0;
  if( p->pLeft ) mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pLeft);
  if( p->pRight ){
    mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pRight);
    assert( p->x.pList==0 );
  }else if( ExprHasProperty(p, EP_xIsSelect) ){
    if( ExprHasProperty(p, EP_VarSelect) ) pMaskSet->bVarSelect = 1;
    mask |= exprSelectUsage(pMaskSet, p->x.pSelect);
  }else if( p->x.pList ){
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->x.pList);
  }
  return mask;
}